

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O1

int Abc_NodeStrashBlifMv(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj)

{
  Abc_Obj_t *pObj_00;
  Vec_Ptr_t *pVVar1;
  Abc_Aig_t *pAVar2;
  int iVar3;
  char *pStr;
  void *pvVar4;
  uint *puVar5;
  Abc_Obj_t *__ptr;
  Abc_Obj_t *pAVar6;
  int *piVar7;
  Abc_Obj_t *pAVar8;
  void *pvVar9;
  Abc_Obj_t *p1;
  Abc_Ntk_t *pAVar10;
  Abc_Ntk_t *pAVar11;
  char cVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  char *pStr_1;
  char *pcVar21;
  char *pcVar22;
  int local_60;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                  ,0x98,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray];
  pVVar1 = pObj_00->pNtk->vAttrs;
  if (pVVar1->nSize < 0xd) {
LAB_00845b65:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar19 = 2;
  if ((pVVar1->pArray[0xc] != (void *)0x0) &&
     (pvVar4 = Abc_ObjMvVar(pObj_00), pvVar4 != (void *)0x0)) {
    puVar5 = (uint *)Abc_ObjMvVar(pObj_00);
    uVar19 = *puVar5;
  }
  __ptr = (Abc_Obj_t *)malloc((long)(int)uVar19 * 8);
  uVar16 = (ulong)uVar19;
  if (0 < (int)uVar19) {
    uVar15 = 0;
    do {
      pAVar6 = Abc_AigConst1(pNtkNew);
      (&__ptr->pNtk)[uVar15] = (Abc_Ntk_t *)((ulong)pAVar6 ^ 1);
      uVar15 = uVar15 + 1;
    } while (uVar16 != uVar15);
  }
  pcVar21 = (char *)(pObj->field_5).pData;
  iVar3 = (pObj->vFanins).nSize;
  if (iVar3 == 0) {
    pcVar22 = pcVar21;
    if (*pcVar21 == 'd') {
      do {
        pcVar21 = pcVar22 + 1;
        cVar12 = *pcVar22;
        pcVar22 = pcVar21;
      } while (cVar12 != '\n');
    }
    pcVar22 = pcVar21 + (*pcVar21 == ' ');
    cVar12 = pcVar21[*pcVar21 == ' '];
    iVar3 = 0;
    if (cVar12 != '-') {
      if (9 < (byte)(cVar12 - 0x30U)) goto LAB_00845b08;
      iVar3 = 0;
      do {
        iVar3 = (int)cVar12 + iVar3 * 10 + -0x30;
        cVar12 = pcVar22[1];
        pcVar22 = pcVar22 + 1;
      } while ((byte)(cVar12 - 0x30U) < 10);
    }
    if ((int)uVar19 <= iVar3) {
      __assert_fail("Index < nValues",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                    ,0xb2,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    if ((uVar19 == 2) && (*pcVar22 == '-')) {
      pAVar6 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_PI);
      __ptr->pNext = pAVar6;
      __ptr->pNtk = (Abc_Ntk_t *)((ulong)pAVar6 ^ 1);
      pcVar21 = Abc_ObjName(pAVar6);
      Abc_ObjAssignName(pAVar6,"free_var_",pcVar21);
    }
    else {
      pAVar10 = (Abc_Ntk_t *)Abc_AigConst1(pNtkNew);
      (&__ptr->pNtk)[iVar3] = pAVar10;
    }
    (pObj_00->field_6).pCopy = __ptr;
  }
  else {
    uVar15 = 0xffffffff;
    if (*pcVar21 == 'd') {
      cVar12 = pcVar21[1];
      if (cVar12 == '-') {
        pcVar21 = pcVar21 + 2;
        uVar18 = 0xffffffff;
        uVar15 = 0;
      }
      else if (cVar12 == '=') {
        cVar12 = pcVar21[2];
        if (9 < (byte)(cVar12 - 0x30U)) {
LAB_00845b08:
          __assert_fail("*pStr >= \'0\' && *pStr <= \'9\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x7d,"int Abc_StringGetNumber(char **)");
        }
        pcVar21 = pcVar21 + 2;
        uVar18 = 0;
        do {
          uVar17 = ((int)cVar12 + (int)uVar18 * 10) - 0x30;
          uVar18 = (ulong)uVar17;
          cVar12 = pcVar21[1];
          pcVar21 = pcVar21 + 1;
        } while ((byte)(cVar12 - 0x30U) < 10);
        uVar15 = 0xffffffff;
        if (iVar3 <= (int)uVar17) {
          __assert_fail("DefIndex < Abc_ObjFaninNum(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0xcc,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
      }
      else {
        if (9 < (byte)(cVar12 - 0x30U)) goto LAB_00845b08;
        pcVar21 = pcVar21 + 1;
        uVar15 = 0;
        do {
          uVar17 = ((int)cVar12 + (int)uVar15 * 10) - 0x30;
          uVar15 = (ulong)uVar17;
          cVar12 = pcVar21[1];
          pcVar21 = pcVar21 + 1;
        } while ((byte)(cVar12 - 0x30U) < 10);
        uVar18 = 0xffffffff;
        if ((int)uVar19 <= (int)uVar17) {
          __assert_fail("Def < nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0xd6,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
      }
      if (*pcVar21 != '\n') {
        __assert_fail("*pSop == \'\\n\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                      ,0xd8,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
      }
      pcVar21 = pcVar21 + 1;
    }
    else {
      uVar18 = 0xffffffff;
    }
    cVar12 = *pcVar21;
    while (cVar12 != '\0') {
      pAVar6 = Abc_AigConst1(pNtkNew);
      iVar3 = (pObj->vFanins).nSize;
      if (0 < iVar3) {
        uVar14 = 0;
        do {
          cVar12 = *pcVar21;
          if (cVar12 == '-') {
            pcVar21 = pcVar21 + 2;
          }
          else {
            pAVar10 = pObj->pNtk;
            if (cVar12 == '!') {
              if (__ptr != (Abc_Obj_t *)0x0) {
                free(__ptr);
              }
              pcVar21 = Abc_ObjName((Abc_Obj_t *)pAVar10->vObjs->pArray[*(pObj->vFanouts).pArray]);
              pcVar22 = 
              "Abc_NodeStrashBlifMv(): Cannot handle complement in the MV function of node %s.\n";
LAB_00845a30:
              printf(pcVar22,pcVar21);
              return 0;
            }
            if (cVar12 == '{') {
              if (__ptr != (Abc_Obj_t *)0x0) {
                free(__ptr);
              }
              pcVar21 = Abc_ObjName((Abc_Obj_t *)pAVar10->vObjs->pArray[*(pObj->vFanouts).pArray]);
              pcVar22 = 
              "Abc_NodeStrashBlifMv(): Cannot handle braces in the MV function of node %s.\n";
              goto LAB_00845a30;
            }
            pAVar8 = (Abc_Obj_t *)pAVar10->vObjs->pArray[(pObj->vFanins).pArray[uVar14]];
            pVVar1 = pAVar8->pNtk->vAttrs;
            if (pVVar1->nSize < 0xd) goto LAB_00845b65;
            iVar3 = 2;
            if ((pVVar1->pArray[0xc] != (void *)0x0) &&
               (pvVar4 = Abc_ObjMvVar(pAVar8), pvVar4 != (void *)0x0)) {
              piVar7 = (int *)Abc_ObjMvVar(pAVar8);
              iVar3 = *piVar7;
            }
            pvVar4 = (pAVar8->field_6).pTemp;
            cVar12 = *pcVar21;
            if (cVar12 == '=') {
              cVar12 = pcVar21[1];
              if (9 < (byte)(cVar12 - 0x30U)) goto LAB_00845b08;
              pcVar21 = pcVar21 + 1;
              uVar17 = 0;
              do {
                uVar17 = ((int)cVar12 + uVar17 * 10) - 0x30;
                cVar12 = pcVar21[1];
                pcVar21 = pcVar21 + 1;
              } while ((byte)(cVar12 - 0x30U) < 10);
              if ((pObj->vFanins).nSize <= (int)uVar17) {
                __assert_fail("Index < Abc_ObjFaninNum(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                              ,0x10c,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
              }
              if (uVar14 == uVar17) {
                __assert_fail("Index != k",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                              ,0x10d,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
              }
              pAVar8 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[(int)uVar17]];
              pVVar1 = pAVar8->pNtk->vAttrs;
              if (pVVar1->nSize < 0xd) goto LAB_00845b65;
              iVar13 = 2;
              if ((pVVar1->pArray[0xc] != (void *)0x0) &&
                 (pvVar9 = Abc_ObjMvVar(pAVar8), pvVar9 != (void *)0x0)) {
                piVar7 = (int *)Abc_ObjMvVar(pAVar8);
                iVar13 = *piVar7;
              }
              if (iVar3 != iVar13) {
                __assert_fail("nValuesF == nValuesF2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                              ,0x113,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
              }
              pvVar9 = (pAVar8->field_6).pTemp;
              pAVar8 = Abc_AigConst1(pNtkNew);
              pAVar8 = (Abc_Obj_t *)((ulong)pAVar8 ^ 1);
              if (0 < (int)uVar19) {
                uVar20 = 0;
                do {
                  pAVar2 = (Abc_Aig_t *)pNtkNew->pManFunc;
                  p1 = Abc_AigAnd(pAVar2,*(Abc_Obj_t **)((long)pvVar4 + uVar20 * 8),
                                  *(Abc_Obj_t **)((long)pvVar9 + uVar20 * 8));
                  pAVar8 = Abc_AigOr(pAVar2,pAVar8,p1);
                  uVar20 = uVar20 + 1;
                } while (uVar16 != uVar20);
              }
            }
            else if (cVar12 == '(') {
              pcVar22 = pcVar21 + 1;
              pAVar8 = Abc_AigConst1(pNtkNew);
              pAVar8 = (Abc_Obj_t *)((ulong)pAVar8 ^ 1);
              cVar12 = pcVar21[1];
              while (cVar12 != ')') {
                if (9 < (byte)(cVar12 - 0x30U)) goto LAB_00845b08;
                iVar13 = 0;
                pcVar22 = pcVar22 + 1;
                do {
                  pcVar21 = pcVar22;
                  iVar13 = (int)cVar12 + iVar13 * 10 + -0x30;
                  cVar12 = *pcVar21;
                  pcVar22 = pcVar21 + 1;
                } while ((byte)(cVar12 - 0x30U) < 10);
                if (iVar3 <= iVar13) {
                  __assert_fail("Index < nValuesF",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                                ,0xfe,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
                }
                pAVar8 = Abc_AigOr((Abc_Aig_t *)pNtkNew->pManFunc,pAVar8,
                                   *(Abc_Obj_t **)((long)pvVar4 + (long)iVar13 * 8));
                if ((*pcVar21 != ',') && (pcVar22 = pcVar21, *pcVar21 != ')')) {
                  __assert_fail("*pSop == \')\' || *pSop == \',\'",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                                ,0x100,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
                }
                cVar12 = *pcVar22;
              }
              pcVar21 = pcVar22 + 1;
            }
            else {
              if (9 < (byte)(cVar12 - 0x30U)) goto LAB_00845b08;
              iVar13 = 0;
              do {
                iVar13 = (int)cVar12 + iVar13 * 10 + -0x30;
                cVar12 = pcVar21[1];
                pcVar21 = pcVar21 + 1;
              } while ((byte)(cVar12 - 0x30U) < 10);
              if (iVar3 <= iVar13) {
                __assert_fail("Index < nValuesF",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                              ,0x11b,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
              }
              pAVar8 = *(Abc_Obj_t **)((long)pvVar4 + (long)iVar13 * 8);
            }
            pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,pAVar6,pAVar8);
            if (*pcVar21 != ' ') {
              __assert_fail("*pSop == \' \'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                            ,0x121,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
            }
            pcVar21 = pcVar21 + 1;
          }
          uVar14 = uVar14 + 1;
          iVar3 = (pObj->vFanins).nSize;
        } while ((long)uVar14 < (long)iVar3);
      }
      cVar12 = *pcVar21;
      if (cVar12 == '=') {
        cVar12 = pcVar21[1];
        if (9 < (byte)(cVar12 - 0x30U)) goto LAB_00845b08;
        pcVar21 = pcVar21 + 1;
        iVar13 = 0;
        do {
          iVar13 = (int)cVar12 + iVar13 * 10 + -0x30;
          cVar12 = pcVar21[1];
          pcVar21 = pcVar21 + 1;
        } while ((byte)(cVar12 - 0x30U) < 10);
        if (iVar3 <= iVar13) {
          __assert_fail("Index < Abc_ObjFaninNum(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x12a,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pAVar8 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[iVar13]];
        pVVar1 = pAVar8->pNtk->vAttrs;
        if (pVVar1->nSize < 0xd) goto LAB_00845b65;
        uVar17 = 2;
        if ((pVVar1->pArray[0xc] != (void *)0x0) &&
           (pvVar4 = Abc_ObjMvVar(pAVar8), pvVar4 != (void *)0x0)) {
          puVar5 = (uint *)Abc_ObjMvVar(pAVar8);
          uVar17 = *puVar5;
        }
        if (uVar17 != uVar19) {
          __assert_fail("nValuesF == nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x12f,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        if (0 < (int)uVar17) {
          pvVar4 = (pAVar8->field_6).pTemp;
          uVar14 = 0;
          do {
            pAVar2 = (Abc_Aig_t *)pNtkNew->pManFunc;
            pAVar10 = (&__ptr->pNtk)[uVar14];
            pAVar8 = Abc_AigAnd(pAVar2,pAVar6,*(Abc_Obj_t **)((long)pvVar4 + uVar14 * 8));
            pAVar10 = (Abc_Ntk_t *)Abc_AigOr(pAVar2,(Abc_Obj_t *)pAVar10,pAVar8);
            (&__ptr->pNtk)[uVar14] = pAVar10;
            uVar14 = uVar14 + 1;
          } while (uVar17 != uVar14);
        }
      }
      else {
        if (9 < (byte)(cVar12 - 0x30U)) goto LAB_00845b08;
        iVar3 = 0;
        do {
          iVar3 = (int)cVar12 + iVar3 * 10 + -0x30;
          cVar12 = pcVar21[1];
          pcVar21 = pcVar21 + 1;
        } while ((byte)(cVar12 - 0x30U) < 10);
        if ((int)uVar19 <= iVar3) {
          __assert_fail("Index < nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x137,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pAVar10 = (Abc_Ntk_t *)
                  Abc_AigOr((Abc_Aig_t *)pNtkNew->pManFunc,(Abc_Obj_t *)(&__ptr->pNtk)[iVar3],pAVar6
                           );
        (&__ptr->pNtk)[iVar3] = pAVar10;
      }
      if (*pcVar21 != '\n') {
        __assert_fail("*pSop == \'\\n\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                      ,0x13b,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
      }
      pcVar22 = pcVar21 + 1;
      pcVar21 = pcVar21 + 1;
      cVar12 = *pcVar22;
    }
    local_60 = (int)uVar18;
    if ((-1 < (int)uVar15) || (-1 < local_60)) {
      pAVar10 = (Abc_Ntk_t *)Abc_AigConst1(pNtkNew);
      if (0 < (int)uVar19) {
        uVar14 = 0;
        do {
          if (uVar15 != uVar14) {
            pAVar10 = (Abc_Ntk_t *)
                      Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,(Abc_Obj_t *)pAVar10,
                                 (Abc_Obj_t *)((ulong)(&__ptr->pNtk)[uVar14] ^ 1));
          }
          uVar14 = uVar14 + 1;
        } while (uVar16 != uVar14);
      }
      if ((int)uVar15 < 0) {
        if (local_60 < 0) {
          __assert_fail("DefIndex >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x14f,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pAVar6 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[uVar18]];
        uVar17 = Abc_ObjMvVarNum(pAVar6);
        if (uVar17 != uVar19) {
          __assert_fail("nValuesF == nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x154,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        if (0 < (int)uVar17) {
          pvVar4 = (pAVar6->field_6).pTemp;
          uVar16 = 0;
          do {
            pAVar2 = (Abc_Aig_t *)pNtkNew->pManFunc;
            pAVar11 = (&__ptr->pNtk)[uVar16];
            pAVar6 = Abc_AigAnd(pAVar2,(Abc_Obj_t *)pAVar10,
                                *(Abc_Obj_t **)((long)pvVar4 + uVar16 * 8));
            pAVar11 = (Abc_Ntk_t *)Abc_AigOr(pAVar2,(Abc_Obj_t *)pAVar11,pAVar6);
            (&__ptr->pNtk)[uVar16] = pAVar11;
            uVar16 = uVar16 + 1;
          } while (uVar17 != uVar16);
        }
      }
      else {
        (&__ptr->pNtk)[uVar15] = pAVar10;
      }
    }
    (pObj_00->field_6).pCopy = __ptr;
  }
  return 1;
}

Assistant:

int Abc_NodeStrashBlifMv( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj )
{
    int fAddFreeVars = 1;
    char * pSop;
    Abc_Obj_t ** pValues, ** pValuesF, ** pValuesF2;
    Abc_Obj_t * pTemp, * pTemp2, * pFanin, * pFanin2, * pNet;
    int k, v, Def, DefIndex, Index, nValues, nValuesF, nValuesF2;

    // start the output values
    assert( Abc_ObjIsNode(pObj) );
    pNet = Abc_ObjFanout0(pObj);
    nValues = Abc_ObjMvVarNum(pNet);
    pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
    for ( k = 0; k < nValues; k++ )
        pValues[k] = Abc_ObjNot( Abc_AigConst1(pNtkNew) );

    // get the BLIF-MV formula
    pSop = (char *)pObj->pData;
    // skip the value line
//    while ( *pSop++ != '\n' );

    // handle the constant
    if ( Abc_ObjFaninNum(pObj) == 0 )
    {
        // skip the default if present
        if ( *pSop == 'd' )
            while ( *pSop++ != '\n' );
        // skip space if present
        if ( *pSop == ' ' )
            pSop++;
        // assume don't-care constant to be zero
        if ( *pSop == '-' )
            Index = 0;
        else
            Index = Abc_StringGetNumber( &pSop );
        assert( Index < nValues );
        ////////////////////////////////////////////
        // adding free variables for binary ND-constants
        if ( fAddFreeVars && nValues == 2 && *pSop == '-' )
        {
            pValues[1] = Abc_NtkCreatePi(pNtkNew);
            pValues[0] = Abc_ObjNot( pValues[1] );
            Abc_ObjAssignName( pValues[1], "free_var_", Abc_ObjName(pValues[1]) );
        }
        else
            pValues[Index] = Abc_AigConst1(pNtkNew);
        ////////////////////////////////////////////
        // save the values in the fanout net
        pNet->pCopy = (Abc_Obj_t *)pValues;
        return 1;
    }

    // parse the default line
    Def = DefIndex = -1;
    if ( *pSop == 'd' )
    {
        pSop++;
        if ( *pSop == '=' )
        {
            pSop++;
            DefIndex = Abc_StringGetNumber( &pSop );
            assert( DefIndex < Abc_ObjFaninNum(pObj) );
        }
        else if ( *pSop == '-' )
        {
            pSop++;
            Def = 0;
        }
        else
        {
            Def = Abc_StringGetNumber( &pSop );
            assert( Def < nValues );
        }
        assert( *pSop == '\n' );
        pSop++;
    }

    // convert the values
    while ( *pSop )
    {
        // extract the values for each cube
        pTemp = Abc_AigConst1(pNtkNew); 
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( *pSop == '-' )
            {
                pSop += 2;
                continue;
            }
            if ( *pSop == '!' )
            {
                ABC_FREE( pValues );
                printf( "Abc_NodeStrashBlifMv(): Cannot handle complement in the MV function of node %s.\n", Abc_ObjName(Abc_ObjFanout0(pObj)) );
                return 0;
            }
            if ( *pSop == '{' )
            {
                ABC_FREE( pValues );
                printf( "Abc_NodeStrashBlifMv(): Cannot handle braces in the MV function of node %s.\n", Abc_ObjName(Abc_ObjFanout0(pObj)) );
                return 0;
            }
            // get the value set
            nValuesF = Abc_ObjMvVarNum(pFanin);
            pValuesF = (Abc_Obj_t **)pFanin->pCopy;
            if ( *pSop == '(' )
            {
                pSop++;
                pTemp2 = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                while ( *pSop != ')' )
                {
                    Index = Abc_StringGetNumber( &pSop );
                    assert( Index < nValuesF );
                    pTemp2 = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp2, pValuesF[Index] );
                    assert( *pSop == ')' || *pSop == ',' );
                    if ( *pSop == ',' )
                        pSop++;
                }
                assert( *pSop == ')' );
                pSop++;
            }
            else if ( *pSop == '=' )
            {
                pSop++;
                // get the fanin index
                Index = Abc_StringGetNumber( &pSop );
                assert( Index < Abc_ObjFaninNum(pObj) );
                assert( Index != k );
                // get the fanin
                pFanin2 = Abc_ObjFanin( pObj, Index );
                nValuesF2 = Abc_ObjMvVarNum(pFanin2);
                pValuesF2 = (Abc_Obj_t **)pFanin2->pCopy;
                // create the sum of products of values
                assert( nValuesF == nValuesF2 );
                pTemp2 = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                for ( v = 0; v < nValues; v++ )
                    pTemp2 = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp2, Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pValuesF[v], pValuesF2[v]) );
            }
            else
            {
                Index = Abc_StringGetNumber( &pSop );
                assert( Index < nValuesF );
                pTemp2 = pValuesF[Index];
            }
            // compute the compute
            pTemp = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp, pTemp2 );
            // advance the reading point
            assert( *pSop == ' ' );
            pSop++;
        }
        // check if the output value is an equal construct
        if ( *pSop == '=' )
        {
            pSop++;
            // get the output value
            Index = Abc_StringGetNumber( &pSop );
            assert( Index < Abc_ObjFaninNum(pObj) );
            // add values of the given fanin with the given cube
            pFanin = Abc_ObjFanin( pObj, Index );
            nValuesF = Abc_ObjMvVarNum(pFanin);
            pValuesF = (Abc_Obj_t **)pFanin->pCopy;
            assert( nValuesF == nValues ); // should be guaranteed by the parser
            for ( k = 0; k < nValuesF; k++ )
                pValues[k] = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[k], Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pTemp, pValuesF[k]) );
        }
        else
        {
            // get the output value
            Index = Abc_StringGetNumber( &pSop );
            assert( Index < nValues );
            pValues[Index] = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[Index], pTemp );
        }
        // advance the reading point
        assert( *pSop == '\n' );
        pSop++;
    }

    // compute the default value
    if ( Def >= 0 || DefIndex >= 0 )
    {
        pTemp = Abc_AigConst1(pNtkNew);
        for ( k = 0; k < nValues; k++ )
        {
            if ( k == Def )
                continue;
            pTemp = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp, Abc_ObjNot(pValues[k]) );
        }

        // assign the default value
        if ( Def >= 0 )
            pValues[Def] = pTemp;
        else
        {
            assert( DefIndex >= 0 );
            // add values of the given fanin with the given cube
            pFanin = Abc_ObjFanin( pObj, DefIndex );
            nValuesF = Abc_ObjMvVarNum(pFanin);
            pValuesF = (Abc_Obj_t **)pFanin->pCopy;
            assert( nValuesF == nValues ); // should be guaranteed by the parser
            for ( k = 0; k < nValuesF; k++ )
                pValues[k] = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[k], Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pTemp, pValuesF[k]) );
        }

    }

    // save the values in the fanout net
    pNet->pCopy = (Abc_Obj_t *)pValues;
    return 1;
}